

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_xoshiro256pp_tests(void)

{
  int iVar1;
  uchar buf32_expected [32];
  uchar seed16 [16];
  uchar buf32 [32];
  int i_1;
  size_t i;
  undefined8 local_68;
  uchar *b32;
  undefined1 local_38 [44];
  int local_c;
  ulong local_8;
  
  for (local_8 = 0; local_8 < 4; local_8 = local_8 + 1) {
    if (secp256k1_test_state[local_8] != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x68,"test condition failed: secp256k1_test_state[i] == 0");
      abort();
    }
  }
  local_68 = 0xf0e36cb516a9ccaf;
  b32 = (uchar *)0x3608a547e0453f44;
  testrand_seed((uchar *)buf32._0_8_);
  for (local_c = 0; local_c < 0x11; local_c = local_c + 1) {
    testrand256(b32);
  }
  iVar1 = secp256k1_memcmp_var(local_38,&local_68,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x7c,
            "test condition failed: secp256k1_memcmp_var(buf32, buf32_expected, sizeof(buf32)) == 0"
           );
    abort();
  }
  return;
}

Assistant:

static void run_xoshiro256pp_tests(void) {
    {
        size_t i;
        /* Sanity check that we run before the actual seeding. */
        for (i = 0; i < sizeof(secp256k1_test_state)/sizeof(secp256k1_test_state[0]); i++) {
            CHECK(secp256k1_test_state[i] == 0);
        }
    }
    {
        int i;
        unsigned char buf32[32];
        unsigned char seed16[16] = {
            'C', 'H', 'I', 'C', 'K', 'E', 'N', '!',
            'C', 'H', 'I', 'C', 'K', 'E', 'N', '!',
        };
        unsigned char buf32_expected[32] = {
            0xAF, 0xCC, 0xA9, 0x16, 0xB5, 0x6C, 0xE3, 0xF0,
            0x44, 0x3F, 0x45, 0xE0, 0x47, 0xA5, 0x08, 0x36,
            0x4C, 0xCC, 0xC1, 0x18, 0xB2, 0xD8, 0x8F, 0xEF,
            0x43, 0x26, 0x15, 0x57, 0x37, 0x00, 0xEF, 0x30,
        };
        testrand_seed(seed16);
        for (i = 0; i < 17; i++) {
            testrand256(buf32);
        }
        CHECK(secp256k1_memcmp_var(buf32, buf32_expected, sizeof(buf32)) == 0);
    }
}